

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue3i
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,GLint x,
               GLint y,GLint z)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<int[3]> state;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetUniformiv(gl,program,location,state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::verifyValidity
                    (&state,testCtx);
  if ((bVar1) && (((state.m_value[0] != x || (state.m_value[1] != y)) || (state.m_value[2] != z))))
  {
    local_1b0._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"// ERROR: expected [");
    std::ostream::operator<<(this,x);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,y);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,z);
    std::operator<<((ostream *)this,"]; got [");
    std::ostream::operator<<(this,state.m_value[0]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,state.m_value[1]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,state.m_value[2]);
    std::operator<<((ostream *)this,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue3i (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, GLint x, GLint y, GLint z)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[3]> state;
	gl.glGetUniformiv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y ||
		state[2] != z)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y << ", "
		<< z
		<< "]; got ["
		<< state[0] << ", "
		<< state[1] << ", "
		<< state[2]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}